

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidget::lower(QWidget *this)

{
  bool bVar1;
  QWidgetPrivate *this_00;
  QWidgetPrivate *pQVar2;
  qsizetype qVar3;
  pointer pQVar4;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  int from;
  int parentChildCount;
  QWidget *p;
  QWidgetPrivate *d;
  QEvent e;
  int in_stack_ffffffffffffffc0;
  WidgetAttribute in_stack_ffffffffffffffc4;
  QWidget *in_stack_ffffffffffffffc8;
  QWidgetPrivate *this_01;
  undefined1 *local_20;
  undefined1 *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  this_00 = d_func((QWidget *)0x380949);
  bVar1 = isWindow((QWidget *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  if (!bVar1) {
    in_stack_ffffffffffffffc8 = parentWidget((QWidget *)0x380968);
    pQVar2 = d_func((QWidget *)0x380977);
    qVar3 = QList<QObject_*>::size((QList<QObject_*> *)&pQVar2->field_0x18);
    in_stack_ffffffffffffffc4 = (WidgetAttribute)qVar3;
    if ((int)in_stack_ffffffffffffffc4 < 2) goto LAB_00380ace;
    d_func((QWidget *)0x38099d);
    qVar3 = QListSpecialMethodsBase<QObject*>::indexOf<QWidget*>
                      ((QListSpecialMethodsBase<QObject_*> *)
                       CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       (QWidget **)in_RDI,0x3809bb);
    in_stack_ffffffffffffffc0 = (int)qVar3;
    if (in_stack_ffffffffffffffc0 != 0) {
      d_func((QWidget *)0x3809d0);
      QList<QObject_*>::move
                ((QList<QObject_*> *)this_00,(qsizetype)in_stack_ffffffffffffffc8,
                 CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    }
    bVar1 = testAttribute(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
    if ((bVar1) ||
       (bVar1 = testAttribute(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4), !bVar1)) {
      if (in_stack_ffffffffffffffc0 == 0) goto LAB_00380ace;
    }
    else {
      create(this,(WId)d,p._7_1_,p._6_1_);
    }
  }
  bVar1 = testAttribute(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
  if (bVar1) {
    QWidgetPrivate::lower_sys(this_01);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x380a5e);
  if ((bVar1) &&
     (pQVar4 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                         ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x380a72),
     (*(ushort *)&pQVar4->field_0x7c >> 8 & 1) != 0)) {
    QWindowContainer::parentWasLowered
              ((QWidget *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  }
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  QEvent::QEvent((QEvent *)&local_20,ZOrderChange);
  QCoreApplication::sendEvent((QObject *)in_RDI,(QEvent *)&local_20);
  QEvent::~QEvent((QEvent *)&local_20);
LAB_00380ace:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidget::lower()
{
    Q_D(QWidget);
    if (!isWindow()) {
        QWidget *p = parentWidget();
        const int parentChildCount = p->d_func()->children.size();
        if (parentChildCount < 2)
            return;
        const int from = p->d_func()->children.indexOf(this);
        Q_ASSERT(from >= 0);
        // Do nothing if the widget is already in correct stacking order _and_ created.
        if (from != 0)
            p->d_func()->children.move(from, 0);
        if (!testAttribute(Qt::WA_WState_Created) && p->testAttribute(Qt::WA_WState_Created))
            create();
        else if (from == 0)
            return;
    }
    if (testAttribute(Qt::WA_WState_Created))
        d->lower_sys();

    if (d->extra && d->extra->hasWindowContainer)
        QWindowContainer::parentWasLowered(this);

    QEvent e(QEvent::ZOrderChange);
    QCoreApplication::sendEvent(this, &e);
}